

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

affine3f * pbrt::math::affine3f::rotate(affine3f *__return_storage_ptr__,vec3f *_u,float r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vec3f vVar5;
  float local_38;
  float fStack_34;
  
  vVar5 = normalize(_u);
  fVar3 = vVar5.z;
  fVar1 = sinf(r);
  fVar2 = cosf(r);
  local_38 = vVar5.x;
  fStack_34 = vVar5.y;
  fVar4 = 1.0 - fVar2;
  (__return_storage_ptr__->l).vx.x = (1.0 - local_38 * local_38) * fVar2 + local_38 * local_38;
  (__return_storage_ptr__->l).vx.y = fVar3 * fVar1 + fVar4 * local_38 * fStack_34;
  (__return_storage_ptr__->l).vx.z = -(fStack_34 * fVar1) + fVar4 * fVar3 * local_38;
  (__return_storage_ptr__->l).vy.x = -(fVar3 * fVar1) + fVar4 * local_38 * fStack_34;
  (__return_storage_ptr__->l).vy.y = (1.0 - fStack_34 * fStack_34) * fVar2 + fStack_34 * fStack_34;
  (__return_storage_ptr__->l).vy.z = fVar1 * local_38 + fVar4 * fVar3 * fStack_34;
  (__return_storage_ptr__->l).vz.x = fStack_34 * fVar1 + fVar4 * fVar3 * local_38;
  (__return_storage_ptr__->l).vz.y = -(fVar1 * local_38) + fVar4 * fVar3 * fStack_34;
  (__return_storage_ptr__->l).vz.z = (1.0 - fVar3 * fVar3) * fVar2 + fVar3 * fVar3;
  (__return_storage_ptr__->p).x = 0.0;
  (__return_storage_ptr__->p).y = 0.0;
  (__return_storage_ptr__->p).z = 0.0;
  return __return_storage_ptr__;
}

Assistant:

inline affine3f affine3f::rotate(const vec3f& _u, float r) {
      vec3f u = normalize(_u);
      float s = sinf(r), c = cosf(r);
      mat3f l = mat3f(vec3f(u.x*u.x+(1-u.x*u.x)*c, u.x*u.y*(1-c)+u.z*s, u.x*u.z*(1-c)-u.y*s),
                      vec3f(u.x*u.y*(1-c)-u.z*s, u.y*u.y+(1-u.y*u.y)*c, u.y*u.z*(1-c)+u.x*s),   
                      vec3f(u.x*u.z*(1-c)+u.y*s, u.y*u.z*(1-c)-u.x*s, u.z*u.z+(1-u.z*u.z)*c));
      return affine3f(l, vec3f(0));
    }